

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

float __thiscall Assimp::CFIReaderImpl::getAttributeValueAsFloat(CFIReaderImpl *this,int idx)

{
  int iVar1;
  undefined4 extraout_var;
  ai_real aVar2;
  shared_ptr<const_Assimp::FIFloatValue> floatValue;
  shared_ptr<const_Assimp::FIValue> local_28;
  
  aVar2 = 0.0;
  if ((-1 < idx) &&
     (idx < (int)(((long)(this->attributes).
                         super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->attributes).
                        super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x90))) {
    std::dynamic_pointer_cast<Assimp::FIFloatValue_const,Assimp::FIValue_const>(&local_28);
    if (local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar1 = (**((this->attributes).
                  super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start[(uint)idx].value.
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_FIValue)();
      aVar2 = fast_atof(*(char **)CONCAT44(extraout_var,iVar1));
    }
    else {
      aVar2 = 0.0;
      if ((long)local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr[2]._vptr_FIValue -
          (long)local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr[1]._vptr_FIValue == 4) {
        aVar2 = *(ai_real *)
                 local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr[1]._vptr_FIValue;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return aVar2;
}

Assistant:

virtual float getAttributeValueAsFloat(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return 0;
        }
        std::shared_ptr<const FIFloatValue> floatValue = std::dynamic_pointer_cast<const FIFloatValue>(attributes[idx].value);
        if (floatValue) {
            return floatValue->value.size() == 1 ? floatValue->value.front() : 0;
        }
        return fast_atof(attributes[idx].value->toString().c_str());
    }